

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry *
NscBuildStatement(CNscPStackEntry *pList,CNscPStackEntry *pStatement,CNscPStackEntry *pFence)

{
  uchar *pauchData;
  size_t nSize;
  CNwnDoubleLinkList *pCVar1;
  CNscPStackEntry *pCVar2;
  CNscContext *pCVar3;
  NscType NVar4;
  CNwnDoubleLinkList *pCVar5;
  int nLocals;
  
  if (pList == (CNscPStackEntry *)0x0) {
    pList = CNscContext::GetPStackEntryInt(g_pCtx);
  }
  if ((g_pCtx->m_fPhase2 != false) || (g_pCtx->m_fNWScript == true)) {
    NVar4 = NscType_Error;
    if (pList->m_nType == NscType_Error) goto LAB_001523a4;
    if (pStatement != (CNscPStackEntry *)0x0) {
      NVar4 = pStatement->m_nType;
      if (NVar4 == NscType_Error) {
        NVar4 = (uint)(NVar4 == NscType_Error) * 2;
        goto LAB_001523a4;
      }
      if (pFence == (CNscPStackEntry *)0x0) {
        nLocals = 0;
      }
      else {
        nLocals = g_pCtx->m_pCurrentFence->nLocals;
      }
      if (NVar4 != NscType_Unknown) {
        CNscPStackEntry::PushSimpleOp(pStatement,NscPCode_ExpressionEnd,NVar4);
      }
      pauchData = pStatement->m_pauchData;
      nSize = pStatement->m_nDataSize;
      if (pFence == (CNscPStackEntry *)0x0) {
        CNscPStackEntry::MakeRoom(pList,nSize);
        memcpy(pList->m_pauchData + pList->m_nDataSize,pauchData,nSize);
        pList->m_nDataSize = pList->m_nDataSize + nSize;
      }
      else {
        CNscPStackEntry::PushStatement(pList,nLocals,pauchData,nSize);
      }
    }
  }
  NVar4 = NscType_Unknown;
LAB_001523a4:
  if (pList->m_nType == NscType_Unknown) {
    pList->m_nType = NVar4;
  }
  if (pFence != (CNscPStackEntry *)0x0) {
    CNscContext::RestoreFence(g_pCtx,pFence);
    pCVar3 = g_pCtx;
    pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
    pCVar2 = (CNscPStackEntry *)(pFence->m_link).m_pNext;
    if (pCVar2 != pFence) {
      pCVar5 = (pFence->m_link).m_pPrev;
      (pCVar2->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar2;
      (pFence->m_link).m_pNext = &pFence->m_link;
      (pFence->m_link).m_pPrev = &pFence->m_link;
    }
    pCVar5 = &pCVar3->m_listEntryFree;
    if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == pFence) {
      pCVar5 = pCVar1;
    }
    pCVar1 = pCVar5->m_pNext;
    (pFence->m_link).m_pNext = pCVar1;
    (pFence->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = &pFence->m_link;
    pCVar1->m_pPrev = &pFence->m_link;
  }
  pCVar3 = g_pCtx;
  if (pStatement != (CNscPStackEntry *)0x0) {
    pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
    pCVar2 = (CNscPStackEntry *)(pStatement->m_link).m_pNext;
    if (pCVar2 != pStatement) {
      pCVar5 = (pStatement->m_link).m_pPrev;
      (pCVar2->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar2;
      (pStatement->m_link).m_pNext = &pStatement->m_link;
      (pStatement->m_link).m_pPrev = &pStatement->m_link;
    }
    pCVar5 = &pCVar3->m_listEntryFree;
    if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == pStatement) {
      pCVar5 = pCVar1;
    }
    pCVar1 = pCVar5->m_pNext;
    (pStatement->m_link).m_pNext = pCVar1;
    (pStatement->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = &pStatement->m_link;
    pCVar1->m_pPrev = &pStatement->m_link;
  }
  return pList;
}

Assistant:

YYSTYPE NscBuildStatement (YYSTYPE pList, YYSTYPE pStatement, YYSTYPE pFence)
{

	//
	// If there isn't an list, then create
	//

	CNscPStackEntry *pOut = pList;
	if (pOut == NULL)
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);


	//
	// If this is phase1 and we are in a function, do nothing
	//

	NscType nOutType;
	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		nOutType = NscType_Unknown;
	}
	
	//
	// Check for errors
	//

	else if (pOut ->GetType () == NscType_Error ||
		(pStatement != NULL && pStatement ->GetType () == NscType_Error))
	{
		nOutType = NscType_Error;
	}

	//
	// Otherwise, we are good
	//

	else
	{

		//
		// Set the return type
		//

		nOutType = NscType_Unknown;

		//
		// If we have a statement 
		//

		if (pStatement != NULL)
		{

			//
			// Compute the size of the locals from the fence
			//

			int nLocals = 0;
			if (pFence)
			{
				NscSymbolFence *pFence = g_pCtx ->GetCurrentFence ();
				nLocals = pFence ->nLocals;
			}

			//
			// If the statement has a type, then add an end expression
			//

			if (pStatement ->GetType () != NscType_Unknown)
			{
				pStatement ->PushSimpleOp (NscPCode_ExpressionEnd, 
					pStatement ->GetType ());
			}

			//
			// If we have a fence, then push the whole block as a
			// statement.  Otherwise, just append as one more in
			// a series of statements.
			//

			if (pFence != NULL)
			{
				pOut ->PushStatement (
					nLocals,
					pStatement ->GetData (), 
					pStatement ->GetDataSize ());
			}

			//
			// Otherwise, we just do a simple append
			//

			else
			{
				pOut ->AppendData (pStatement);
			}
		}
	}

	//
	// Set the new type
	//

	if (pOut ->GetType () == NscType_Unknown)
		pOut ->SetType (nOutType);

	//
	// Process the fence
	//

	if (pFence != NULL)
	{
		g_pCtx ->RestoreFence (pFence);
		g_pCtx ->FreePStackEntry (pFence);
	}

	//
	// Return the new argument list
	//

	if (pStatement)
        g_pCtx ->FreePStackEntry (pStatement);
	return pOut;
}